

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O1

int __thiscall ktx::OptionsHelp::init(OptionsHelp *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  int iVar4;
  int extraout_EAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  shared_ptr<const_cxxopts::Value> local_e8;
  OptionAdder local_d8;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_138 = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  uVar3 = local_128._M_allocated_capacity._0_4_;
  local_d8.m_group._M_string_length = local_130;
  paVar1 = &local_118.field_2;
  if (local_138 == &local_128) {
    local_118.field_2._8_4_ = local_128._8_4_;
    local_118.field_2._12_4_ = local_128._12_4_;
    local_118._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_118._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.field_2._M_allocated_capacity._4_4_ = local_128._M_allocated_capacity._4_4_;
  local_118.field_2._M_allocated_capacity._0_4_ = local_128._M_allocated_capacity._0_4_;
  local_118._M_string_length = local_130;
  local_130 = 0;
  local_128._M_allocated_capacity._0_4_ = local_128._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar2 = &local_d8.m_group.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar1) {
    local_d8.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_128._M_allocated_capacity._4_4_,uVar3);
    local_d8.m_group.field_2._8_4_ = local_118.field_2._8_4_;
    local_d8.m_group.field_2._12_4_ = local_118.field_2._12_4_;
    local_d8.m_group._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.m_group._M_dataplus._M_p = local_118._M_dataplus._M_p;
    local_d8.m_group.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
  }
  local_138 = &local_128;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  local_d8.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"command","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"The command for which usage should be displayed.","");
  cxxopts::value<std::__cxx11::string>();
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f8;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_f0;
  local_f8 = (element_type *)0x0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  cxxopts::OptionAdder::operator()(&local_d8,&local_118,&local_90,&local_e8,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_group._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8.m_group._M_dataplus._M_p,
                    local_d8.m_group.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,
                    CONCAT44(local_128._M_allocated_capacity._4_4_,
                             local_128._M_allocated_capacity._0_4_) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"command","");
  cxxopts::Options::parse_positional((Options *)ctx,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"<command>","");
  iVar4 = std::__cxx11::string::operator=((string *)(ctx + 0x60),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("command", "The command for which usage should be displayed.", cxxopts::value<std::string>());
        opts.parse_positional("command");
        opts.positional_help("<command>");
    }